

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O2

int Aig_ManCleanup(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  void *Entry;
  Aig_Obj_t *pObj;
  int iVar3;
  int i;
  
  iVar1 = p->nObjs[5];
  iVar2 = p->nObjs[6];
  p_00 = Vec_PtrAlloc(100);
  for (iVar3 = 0; iVar3 < p->vObjs->nSize; iVar3 = iVar3 + 1) {
    Entry = Vec_PtrEntry(p->vObjs,iVar3);
    if (((Entry != (void *)0x0) && (*(uint *)((long)Entry + 0x18) < 0x40)) &&
       ((*(uint *)((long)Entry + 0x18) & 7) - 5 < 2)) {
      Vec_PtrPush(p_00,Entry);
    }
  }
  iVar3 = p_00->nSize;
  i = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (; iVar3 != i; i = i + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p_00,i);
    Aig_ObjDelete_rec(p,pObj,1);
  }
  Vec_PtrFree(p_00);
  return (iVar2 + iVar1) - (p->nObjs[5] + p->nObjs[6]);
}

Assistant:

int Aig_ManCleanup( Aig_Man_t * p )
{
    Vec_Ptr_t * vObjs;
    Aig_Obj_t * pNode;
    int i, nNodesOld = Aig_ManNodeNum(p);
    // collect roots of dangling nodes
    vObjs = Vec_PtrAlloc( 100 );
    Aig_ManForEachObj( p, pNode, i )
        if ( Aig_ObjIsNode(pNode) && Aig_ObjRefs(pNode) == 0 )
            Vec_PtrPush( vObjs, pNode );
    // recursively remove dangling nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vObjs, pNode, i )
        Aig_ObjDelete_rec( p, pNode, 1 );
    Vec_PtrFree( vObjs );
    return nNodesOld - Aig_ManNodeNum(p);
}